

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::contactPairTest
          (cbtCollisionWorld *this,cbtCollisionObject *colObjA,cbtCollisionObject *colObjB,
          ContactResultCallback *resultCallback)

{
  int iVar1;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper obB;
  cbtCollisionObjectWrapper obA;
  cbtBridgedManifoldResult contactPointResult;
  cbtCollisionObjectWrapper local_c0;
  cbtCollisionObjectWrapper local_98;
  cbtManifoldResult local_70;
  ContactResultCallback *local_38;
  long *plVar2;
  
  local_98.m_shape = colObjA->m_collisionShape;
  local_98.m_parent = (cbtCollisionObjectWrapper *)0x0;
  local_98.m_worldTransform = &colObjA->m_worldTransform;
  local_98.m_partId = -1;
  local_98.m_index = -1;
  local_c0.m_shape = colObjB->m_collisionShape;
  local_c0.m_parent = (cbtCollisionObjectWrapper *)0x0;
  local_c0.m_worldTransform = &colObjB->m_worldTransform;
  local_c0.m_partId = -1;
  local_c0.m_index = -1;
  local_c0.m_collisionObject = colObjB;
  local_98.m_collisionObject = colObjA;
  iVar1 = (*this->m_dispatcher1->_vptr_cbtDispatcher[2])
                    (this->m_dispatcher1,&local_98,&local_c0,0,2);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    cbtManifoldResult::cbtManifoldResult(&local_70,&local_98,&local_c0);
    local_70.super_Result._vptr_Result = (_func_int **)&PTR__Result_00b70120;
    local_70.m_closestPointDistanceThreshold = *(cbtScalar *)(resultCallback + 0x10);
    local_38 = resultCallback;
    (**(code **)(*plVar2 + 0x10))(plVar2,&local_98,&local_c0,&this->m_dispatchInfo,&local_70);
    (**(code **)*plVar2)(plVar2);
    (*this->m_dispatcher1->_vptr_cbtDispatcher[0xf])(this->m_dispatcher1,plVar2);
  }
  return;
}

Assistant:

void cbtCollisionWorld::contactPairTest(cbtCollisionObject* colObjA, cbtCollisionObject* colObjB, ContactResultCallback& resultCallback)
{
	cbtCollisionObjectWrapper obA(0, colObjA->getCollisionShape(), colObjA, colObjA->getWorldTransform(), -1, -1);
	cbtCollisionObjectWrapper obB(0, colObjB->getCollisionShape(), colObjB, colObjB->getWorldTransform(), -1, -1);

	cbtCollisionAlgorithm* algorithm = getDispatcher()->findAlgorithm(&obA, &obB, 0, BT_CLOSEST_POINT_ALGORITHMS);
	if (algorithm)
	{
		cbtBridgedManifoldResult contactPointResult(&obA, &obB, resultCallback);
		contactPointResult.m_closestPointDistanceThreshold = resultCallback.m_closestDistanceThreshold;
		//discrete collision detection query
		algorithm->processCollision(&obA, &obB, getDispatchInfo(), &contactPointResult);

		algorithm->~cbtCollisionAlgorithm();
		getDispatcher()->freeCollisionAlgorithm(algorithm);
	}
}